

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.h
# Opt level: O0

void __thiscall llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid(SmallPtrSetIteratorImpl *this)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  SmallPtrSetIteratorImpl *this_local;
  
  if (this->End < this->Bucket) {
    __assert_fail("Bucket <= End",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallPtrSet.h"
                  ,0xf9,"void llvm::SmallPtrSetIteratorImpl::AdvanceIfNotValid()");
  }
  while( true ) {
    bVar3 = false;
    if (this->Bucket != this->End) {
      pvVar1 = *this->Bucket;
      pvVar2 = SmallPtrSetImplBase::getEmptyMarker();
      bVar3 = true;
      if (pvVar1 != pvVar2) {
        pvVar1 = *this->Bucket;
        pvVar2 = SmallPtrSetImplBase::getTombstoneMarker();
        bVar3 = pvVar1 == pvVar2;
      }
    }
    if (!bVar3) break;
    this->Bucket = this->Bucket + 1;
  }
  return;
}

Assistant:

void AdvanceIfNotValid() {
    assert(Bucket <= End);
    while (Bucket != End &&
           (*Bucket == SmallPtrSetImplBase::getEmptyMarker() ||
            *Bucket == SmallPtrSetImplBase::getTombstoneMarker()))
      ++Bucket;
  }